

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::CopyPropagateArrays::FindStoreInstruction
          (CopyPropagateArrays *this,Instruction *var_inst)

{
  Instruction *def;
  DefUseManager *this_00;
  anon_class_16_2_f7a72653 local_50;
  function<bool_(spvtools::opt::Instruction_*)> local_40;
  Instruction *local_20;
  Instruction *store_inst;
  Instruction *var_inst_local;
  CopyPropagateArrays *this_local;
  
  local_20 = (Instruction *)0x0;
  store_inst = var_inst;
  var_inst_local = (Instruction *)this;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  def = store_inst;
  local_50.store_inst = &local_20;
  local_50.var_inst = store_inst;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::CopyPropagateArrays::FindStoreInstruction(spvtools::opt::Instruction_const*)const::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_40,&local_50);
  analysis::DefUseManager::WhileEachUser(this_00,def,&local_40);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return local_20;
}

Assistant:

Instruction* CopyPropagateArrays::FindStoreInstruction(
    const Instruction* var_inst) const {
  Instruction* store_inst = nullptr;
  get_def_use_mgr()->WhileEachUser(
      var_inst, [&store_inst, var_inst](Instruction* use) {
        if (use->opcode() == spv::Op::OpStore &&
            use->GetSingleWordInOperand(kStorePointerInOperand) ==
                var_inst->result_id()) {
          if (store_inst == nullptr) {
            store_inst = use;
          } else {
            store_inst = nullptr;
            return false;
          }
        }
        return true;
      });
  return store_inst;
}